

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O3

int addk(FuncState *fs,Proto *f,TValue *v)

{
  byte bVar1;
  int nelems;
  lua_State *L;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  TValue *pTVar30;
  long lVar31;
  long lVar32;
  lu_byte *plVar33;
  ulong uVar34;
  undefined1 auVar35 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  int iVar55;
  int iVar58;
  int iVar59;
  undefined1 auVar56 [16];
  int iVar60;
  undefined1 auVar57 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  int iVar74;
  int iVar78;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  
  L = fs->ls->L;
  iVar55 = f->sizek;
  nelems = fs->nk;
  pTVar30 = (TValue *)luaM_growaux_(L,f->k,nelems,&f->sizek,0x10,0x1ffffff,"constants");
  f->k = pTVar30;
  auVar29 = _DAT_0012cad0;
  auVar28 = _DAT_0012cac0;
  auVar27 = _DAT_0012cab0;
  auVar26 = _DAT_0012caa0;
  auVar25 = _DAT_0012ca90;
  auVar24 = _DAT_0012ca80;
  auVar23 = _DAT_0012ca70;
  if (iVar55 < f->sizek) {
    lVar31 = (long)f->sizek - (long)iVar55;
    lVar32 = lVar31 + -1;
    auVar35._8_4_ = (int)lVar32;
    auVar35._0_8_ = lVar32;
    auVar35._12_4_ = (int)((ulong)lVar32 >> 0x20);
    plVar33 = &pTVar30[(long)iVar55 + 0xf].tt_;
    uVar34 = 0;
    do {
      auVar53._8_4_ = (int)uVar34;
      auVar53._0_8_ = uVar34;
      auVar53._12_4_ = (int)(uVar34 >> 0x20);
      auVar56 = auVar35 ^ auVar29;
      auVar61 = (auVar53 | auVar28) ^ auVar29;
      iVar55 = auVar56._0_4_;
      iVar74 = -(uint)(iVar55 < auVar61._0_4_);
      iVar58 = auVar56._4_4_;
      auVar63._4_4_ = -(uint)(iVar58 < auVar61._4_4_);
      iVar59 = auVar56._8_4_;
      iVar78 = -(uint)(iVar59 < auVar61._8_4_);
      iVar60 = auVar56._12_4_;
      auVar63._12_4_ = -(uint)(iVar60 < auVar61._12_4_);
      auVar36._4_4_ = iVar74;
      auVar36._0_4_ = iVar74;
      auVar36._8_4_ = iVar78;
      auVar36._12_4_ = iVar78;
      auVar36 = pshuflw(in_XMM1,auVar36,0xe8);
      auVar62._4_4_ = -(uint)(auVar61._4_4_ == iVar58);
      auVar62._12_4_ = -(uint)(auVar61._12_4_ == iVar60);
      auVar62._0_4_ = auVar62._4_4_;
      auVar62._8_4_ = auVar62._12_4_;
      auVar45 = pshuflw(in_XMM2,auVar62,0xe8);
      auVar63._0_4_ = auVar63._4_4_;
      auVar63._8_4_ = auVar63._12_4_;
      auVar61 = pshuflw(auVar36,auVar63,0xe8);
      auVar56._8_4_ = 0xffffffff;
      auVar56._0_8_ = 0xffffffffffffffff;
      auVar56._12_4_ = 0xffffffff;
      auVar56 = (auVar61 | auVar45 & auVar36) ^ auVar56;
      auVar56 = packssdw(auVar56,auVar56);
      if ((auVar56 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        plVar33[-0xf0] = 0;
      }
      auVar45._4_4_ = iVar74;
      auVar45._0_4_ = iVar74;
      auVar45._8_4_ = iVar78;
      auVar45._12_4_ = iVar78;
      auVar63 = auVar62 & auVar45 | auVar63;
      auVar56 = packssdw(auVar63,auVar63);
      auVar61._8_4_ = 0xffffffff;
      auVar61._0_8_ = 0xffffffffffffffff;
      auVar61._12_4_ = 0xffffffff;
      auVar56 = packssdw(auVar56 ^ auVar61,auVar56 ^ auVar61);
      auVar56 = packsswb(auVar56,auVar56);
      if ((auVar56._0_4_ >> 8 & 1) != 0) {
        plVar33[-0xe0] = 0;
      }
      auVar56 = (auVar53 | auVar27) ^ auVar29;
      auVar46._0_4_ = -(uint)(iVar55 < auVar56._0_4_);
      auVar46._4_4_ = -(uint)(iVar58 < auVar56._4_4_);
      auVar46._8_4_ = -(uint)(iVar59 < auVar56._8_4_);
      auVar46._12_4_ = -(uint)(iVar60 < auVar56._12_4_);
      auVar64._4_4_ = auVar46._0_4_;
      auVar64._0_4_ = auVar46._0_4_;
      auVar64._8_4_ = auVar46._8_4_;
      auVar64._12_4_ = auVar46._8_4_;
      iVar74 = -(uint)(auVar56._4_4_ == iVar58);
      iVar78 = -(uint)(auVar56._12_4_ == iVar60);
      auVar11._4_4_ = iVar74;
      auVar11._0_4_ = iVar74;
      auVar11._8_4_ = iVar78;
      auVar11._12_4_ = iVar78;
      auVar75._4_4_ = auVar46._4_4_;
      auVar75._0_4_ = auVar46._4_4_;
      auVar75._8_4_ = auVar46._12_4_;
      auVar75._12_4_ = auVar46._12_4_;
      auVar56 = auVar11 & auVar64 | auVar75;
      auVar56 = packssdw(auVar56,auVar56);
      auVar2._8_4_ = 0xffffffff;
      auVar2._0_8_ = 0xffffffffffffffff;
      auVar2._12_4_ = 0xffffffff;
      auVar56 = packssdw(auVar56 ^ auVar2,auVar56 ^ auVar2);
      auVar56 = packsswb(auVar56,auVar56);
      if ((auVar56._0_4_ >> 0x10 & 1) != 0) {
        plVar33[-0xd0] = 0;
      }
      auVar56 = pshufhw(auVar56,auVar64,0x84);
      auVar12._4_4_ = iVar74;
      auVar12._0_4_ = iVar74;
      auVar12._8_4_ = iVar78;
      auVar12._12_4_ = iVar78;
      auVar61 = pshufhw(auVar46,auVar12,0x84);
      auVar36 = pshufhw(auVar56,auVar75,0x84);
      auVar37._8_4_ = 0xffffffff;
      auVar37._0_8_ = 0xffffffffffffffff;
      auVar37._12_4_ = 0xffffffff;
      auVar37 = (auVar36 | auVar61 & auVar56) ^ auVar37;
      auVar56 = packssdw(auVar37,auVar37);
      auVar56 = packsswb(auVar56,auVar56);
      if ((auVar56._0_4_ >> 0x18 & 1) != 0) {
        plVar33[-0xc0] = 0;
      }
      auVar56 = (auVar53 | auVar26) ^ auVar29;
      auVar47._0_4_ = -(uint)(iVar55 < auVar56._0_4_);
      auVar47._4_4_ = -(uint)(iVar58 < auVar56._4_4_);
      auVar47._8_4_ = -(uint)(iVar59 < auVar56._8_4_);
      auVar47._12_4_ = -(uint)(iVar60 < auVar56._12_4_);
      auVar13._4_4_ = auVar47._0_4_;
      auVar13._0_4_ = auVar47._0_4_;
      auVar13._8_4_ = auVar47._8_4_;
      auVar13._12_4_ = auVar47._8_4_;
      auVar61 = pshuflw(auVar75,auVar13,0xe8);
      auVar38._0_4_ = -(uint)(auVar56._0_4_ == iVar55);
      auVar38._4_4_ = -(uint)(auVar56._4_4_ == iVar58);
      auVar38._8_4_ = -(uint)(auVar56._8_4_ == iVar59);
      auVar38._12_4_ = -(uint)(auVar56._12_4_ == iVar60);
      auVar65._4_4_ = auVar38._4_4_;
      auVar65._0_4_ = auVar38._4_4_;
      auVar65._8_4_ = auVar38._12_4_;
      auVar65._12_4_ = auVar38._12_4_;
      auVar56 = pshuflw(auVar38,auVar65,0xe8);
      auVar66._4_4_ = auVar47._4_4_;
      auVar66._0_4_ = auVar47._4_4_;
      auVar66._8_4_ = auVar47._12_4_;
      auVar66._12_4_ = auVar47._12_4_;
      auVar36 = pshuflw(auVar47,auVar66,0xe8);
      auVar3._8_4_ = 0xffffffff;
      auVar3._0_8_ = 0xffffffffffffffff;
      auVar3._12_4_ = 0xffffffff;
      auVar56 = packssdw(auVar56 & auVar61,(auVar36 | auVar56 & auVar61) ^ auVar3);
      auVar56 = packsswb(auVar56,auVar56);
      if ((auVar56 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        plVar33[-0xb0] = 0;
      }
      auVar14._4_4_ = auVar47._0_4_;
      auVar14._0_4_ = auVar47._0_4_;
      auVar14._8_4_ = auVar47._8_4_;
      auVar14._12_4_ = auVar47._8_4_;
      auVar66 = auVar65 & auVar14 | auVar66;
      auVar36 = packssdw(auVar66,auVar66);
      auVar4._8_4_ = 0xffffffff;
      auVar4._0_8_ = 0xffffffffffffffff;
      auVar4._12_4_ = 0xffffffff;
      auVar56 = packssdw(auVar56,auVar36 ^ auVar4);
      auVar56 = packsswb(auVar56,auVar56);
      if ((auVar56._4_2_ >> 8 & 1) != 0) {
        plVar33[-0xa0] = 0;
      }
      auVar56 = (auVar53 | auVar25) ^ auVar29;
      auVar48._0_4_ = -(uint)(iVar55 < auVar56._0_4_);
      auVar48._4_4_ = -(uint)(iVar58 < auVar56._4_4_);
      auVar48._8_4_ = -(uint)(iVar59 < auVar56._8_4_);
      auVar48._12_4_ = -(uint)(iVar60 < auVar56._12_4_);
      auVar67._4_4_ = auVar48._0_4_;
      auVar67._0_4_ = auVar48._0_4_;
      auVar67._8_4_ = auVar48._8_4_;
      auVar67._12_4_ = auVar48._8_4_;
      iVar74 = -(uint)(auVar56._4_4_ == iVar58);
      iVar78 = -(uint)(auVar56._12_4_ == iVar60);
      auVar15._4_4_ = iVar74;
      auVar15._0_4_ = iVar74;
      auVar15._8_4_ = iVar78;
      auVar15._12_4_ = iVar78;
      auVar76._4_4_ = auVar48._4_4_;
      auVar76._0_4_ = auVar48._4_4_;
      auVar76._8_4_ = auVar48._12_4_;
      auVar76._12_4_ = auVar48._12_4_;
      auVar56 = auVar15 & auVar67 | auVar76;
      auVar56 = packssdw(auVar56,auVar56);
      auVar5._8_4_ = 0xffffffff;
      auVar5._0_8_ = 0xffffffffffffffff;
      auVar5._12_4_ = 0xffffffff;
      auVar56 = packssdw(auVar56 ^ auVar5,auVar56 ^ auVar5);
      auVar56 = packsswb(auVar56,auVar56);
      if ((auVar56 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        plVar33[-0x90] = 0;
      }
      auVar56 = pshufhw(auVar56,auVar67,0x84);
      auVar16._4_4_ = iVar74;
      auVar16._0_4_ = iVar74;
      auVar16._8_4_ = iVar78;
      auVar16._12_4_ = iVar78;
      auVar61 = pshufhw(auVar48,auVar16,0x84);
      auVar36 = pshufhw(auVar56,auVar76,0x84);
      auVar39._8_4_ = 0xffffffff;
      auVar39._0_8_ = 0xffffffffffffffff;
      auVar39._12_4_ = 0xffffffff;
      auVar39 = (auVar36 | auVar61 & auVar56) ^ auVar39;
      auVar56 = packssdw(auVar39,auVar39);
      auVar56 = packsswb(auVar56,auVar56);
      if ((auVar56._6_2_ >> 8 & 1) != 0) {
        plVar33[-0x80] = 0;
      }
      auVar56 = (auVar53 | auVar24) ^ auVar29;
      auVar49._0_4_ = -(uint)(iVar55 < auVar56._0_4_);
      auVar49._4_4_ = -(uint)(iVar58 < auVar56._4_4_);
      auVar49._8_4_ = -(uint)(iVar59 < auVar56._8_4_);
      auVar49._12_4_ = -(uint)(iVar60 < auVar56._12_4_);
      auVar17._4_4_ = auVar49._0_4_;
      auVar17._0_4_ = auVar49._0_4_;
      auVar17._8_4_ = auVar49._8_4_;
      auVar17._12_4_ = auVar49._8_4_;
      auVar61 = pshuflw(auVar76,auVar17,0xe8);
      auVar40._0_4_ = -(uint)(auVar56._0_4_ == iVar55);
      auVar40._4_4_ = -(uint)(auVar56._4_4_ == iVar58);
      auVar40._8_4_ = -(uint)(auVar56._8_4_ == iVar59);
      auVar40._12_4_ = -(uint)(auVar56._12_4_ == iVar60);
      auVar68._4_4_ = auVar40._4_4_;
      auVar68._0_4_ = auVar40._4_4_;
      auVar68._8_4_ = auVar40._12_4_;
      auVar68._12_4_ = auVar40._12_4_;
      auVar56 = pshuflw(auVar40,auVar68,0xe8);
      auVar69._4_4_ = auVar49._4_4_;
      auVar69._0_4_ = auVar49._4_4_;
      auVar69._8_4_ = auVar49._12_4_;
      auVar69._12_4_ = auVar49._12_4_;
      auVar36 = pshuflw(auVar49,auVar69,0xe8);
      auVar50._8_4_ = 0xffffffff;
      auVar50._0_8_ = 0xffffffffffffffff;
      auVar50._12_4_ = 0xffffffff;
      auVar50 = (auVar36 | auVar56 & auVar61) ^ auVar50;
      auVar36 = packssdw(auVar50,auVar50);
      auVar56 = packsswb(auVar56 & auVar61,auVar36);
      if ((auVar56 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        plVar33[-0x70] = 0;
      }
      auVar18._4_4_ = auVar49._0_4_;
      auVar18._0_4_ = auVar49._0_4_;
      auVar18._8_4_ = auVar49._8_4_;
      auVar18._12_4_ = auVar49._8_4_;
      auVar69 = auVar68 & auVar18 | auVar69;
      auVar36 = packssdw(auVar69,auVar69);
      auVar6._8_4_ = 0xffffffff;
      auVar6._0_8_ = 0xffffffffffffffff;
      auVar6._12_4_ = 0xffffffff;
      auVar36 = packssdw(auVar36 ^ auVar6,auVar36 ^ auVar6);
      auVar56 = packsswb(auVar56,auVar36);
      if ((auVar56._8_2_ >> 8 & 1) != 0) {
        plVar33[-0x60] = 0;
      }
      auVar56 = (auVar53 | auVar23) ^ auVar29;
      auVar51._0_4_ = -(uint)(iVar55 < auVar56._0_4_);
      auVar51._4_4_ = -(uint)(iVar58 < auVar56._4_4_);
      auVar51._8_4_ = -(uint)(iVar59 < auVar56._8_4_);
      auVar51._12_4_ = -(uint)(iVar60 < auVar56._12_4_);
      auVar70._4_4_ = auVar51._0_4_;
      auVar70._0_4_ = auVar51._0_4_;
      auVar70._8_4_ = auVar51._8_4_;
      auVar70._12_4_ = auVar51._8_4_;
      iVar74 = -(uint)(auVar56._4_4_ == iVar58);
      iVar78 = -(uint)(auVar56._12_4_ == iVar60);
      auVar19._4_4_ = iVar74;
      auVar19._0_4_ = iVar74;
      auVar19._8_4_ = iVar78;
      auVar19._12_4_ = iVar78;
      auVar77._4_4_ = auVar51._4_4_;
      auVar77._0_4_ = auVar51._4_4_;
      auVar77._8_4_ = auVar51._12_4_;
      auVar77._12_4_ = auVar51._12_4_;
      auVar56 = auVar19 & auVar70 | auVar77;
      auVar56 = packssdw(auVar56,auVar56);
      auVar7._8_4_ = 0xffffffff;
      auVar7._0_8_ = 0xffffffffffffffff;
      auVar7._12_4_ = 0xffffffff;
      auVar56 = packssdw(auVar56 ^ auVar7,auVar56 ^ auVar7);
      auVar56 = packsswb(auVar56,auVar56);
      if ((auVar56 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        plVar33[-0x50] = 0;
      }
      auVar56 = pshufhw(auVar56,auVar70,0x84);
      auVar20._4_4_ = iVar74;
      auVar20._0_4_ = iVar74;
      auVar20._8_4_ = iVar78;
      auVar20._12_4_ = iVar78;
      auVar61 = pshufhw(auVar51,auVar20,0x84);
      auVar36 = pshufhw(auVar56,auVar77,0x84);
      auVar41._8_4_ = 0xffffffff;
      auVar41._0_8_ = 0xffffffffffffffff;
      auVar41._12_4_ = 0xffffffff;
      auVar41 = (auVar36 | auVar61 & auVar56) ^ auVar41;
      auVar56 = packssdw(auVar41,auVar41);
      auVar56 = packsswb(auVar56,auVar56);
      if ((auVar56._10_2_ >> 8 & 1) != 0) {
        plVar33[-0x40] = 0;
      }
      auVar56 = (auVar53 | _DAT_0012ca60) ^ auVar29;
      auVar52._0_4_ = -(uint)(iVar55 < auVar56._0_4_);
      auVar52._4_4_ = -(uint)(iVar58 < auVar56._4_4_);
      auVar52._8_4_ = -(uint)(iVar59 < auVar56._8_4_);
      auVar52._12_4_ = -(uint)(iVar60 < auVar56._12_4_);
      auVar21._4_4_ = auVar52._0_4_;
      auVar21._0_4_ = auVar52._0_4_;
      auVar21._8_4_ = auVar52._8_4_;
      auVar21._12_4_ = auVar52._8_4_;
      auVar61 = pshuflw(auVar77,auVar21,0xe8);
      auVar42._0_4_ = -(uint)(auVar56._0_4_ == iVar55);
      auVar42._4_4_ = -(uint)(auVar56._4_4_ == iVar58);
      auVar42._8_4_ = -(uint)(auVar56._8_4_ == iVar59);
      auVar42._12_4_ = -(uint)(auVar56._12_4_ == iVar60);
      auVar71._4_4_ = auVar42._4_4_;
      auVar71._0_4_ = auVar42._4_4_;
      auVar71._8_4_ = auVar42._12_4_;
      auVar71._12_4_ = auVar42._12_4_;
      auVar56 = pshuflw(auVar42,auVar71,0xe8);
      auVar72._4_4_ = auVar52._4_4_;
      auVar72._0_4_ = auVar52._4_4_;
      auVar72._8_4_ = auVar52._12_4_;
      auVar72._12_4_ = auVar52._12_4_;
      auVar36 = pshuflw(auVar52,auVar72,0xe8);
      auVar8._8_4_ = 0xffffffff;
      auVar8._0_8_ = 0xffffffffffffffff;
      auVar8._12_4_ = 0xffffffff;
      auVar56 = packssdw(auVar56 & auVar61,(auVar36 | auVar56 & auVar61) ^ auVar8);
      auVar56 = packsswb(auVar56,auVar56);
      if ((auVar56 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        plVar33[-0x30] = 0;
      }
      auVar22._4_4_ = auVar52._0_4_;
      auVar22._0_4_ = auVar52._0_4_;
      auVar22._8_4_ = auVar52._8_4_;
      auVar22._12_4_ = auVar52._8_4_;
      auVar72 = auVar71 & auVar22 | auVar72;
      auVar36 = packssdw(auVar72,auVar72);
      auVar9._8_4_ = 0xffffffff;
      auVar9._0_8_ = 0xffffffffffffffff;
      auVar9._12_4_ = 0xffffffff;
      auVar56 = packssdw(auVar56,auVar36 ^ auVar9);
      auVar56 = packsswb(auVar56,auVar56);
      if ((auVar56._12_2_ >> 8 & 1) != 0) {
        plVar33[-0x20] = 0;
      }
      auVar56 = (auVar53 | _DAT_0012ca50) ^ auVar29;
      auVar43._0_4_ = -(uint)(iVar55 < auVar56._0_4_);
      auVar43._4_4_ = -(uint)(iVar58 < auVar56._4_4_);
      auVar43._8_4_ = -(uint)(iVar59 < auVar56._8_4_);
      auVar43._12_4_ = -(uint)(iVar60 < auVar56._12_4_);
      auVar73._4_4_ = auVar43._0_4_;
      auVar73._0_4_ = auVar43._0_4_;
      auVar73._8_4_ = auVar43._8_4_;
      auVar73._12_4_ = auVar43._8_4_;
      auVar54._4_4_ = -(uint)(auVar56._4_4_ == iVar58);
      auVar54._12_4_ = -(uint)(auVar56._12_4_ == iVar60);
      auVar54._0_4_ = auVar54._4_4_;
      auVar54._8_4_ = auVar54._12_4_;
      auVar57._4_4_ = auVar43._4_4_;
      auVar57._0_4_ = auVar43._4_4_;
      auVar57._8_4_ = auVar43._12_4_;
      auVar57._12_4_ = auVar43._12_4_;
      auVar36 = auVar54 & auVar73 | auVar57;
      auVar56 = packssdw(auVar43,auVar36);
      auVar10._8_4_ = 0xffffffff;
      auVar10._0_8_ = 0xffffffffffffffff;
      auVar10._12_4_ = 0xffffffff;
      auVar56 = packssdw(auVar56 ^ auVar10,auVar56 ^ auVar10);
      auVar56 = packsswb(auVar56,auVar56);
      if ((auVar56 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        plVar33[-0x10] = 0;
      }
      auVar56 = pshufhw(auVar56,auVar73,0x84);
      in_XMM2 = pshufhw(auVar36,auVar54,0x84);
      in_XMM2 = in_XMM2 & auVar56;
      auVar56 = pshufhw(auVar56,auVar57,0x84);
      auVar44._8_4_ = 0xffffffff;
      auVar44._0_8_ = 0xffffffffffffffff;
      auVar44._12_4_ = 0xffffffff;
      auVar44 = (auVar56 | in_XMM2) ^ auVar44;
      auVar56 = packssdw(auVar44,auVar44);
      in_XMM1 = packsswb(auVar56,auVar56);
      if ((in_XMM1._14_2_ >> 8 & 1) != 0) {
        *plVar33 = '\0';
      }
      uVar34 = uVar34 + 0x10;
      plVar33 = plVar33 + 0x100;
    } while ((lVar31 + 0xfU & 0xfffffffffffffff0) != uVar34);
  }
  pTVar30[nelems].value_ = v->value_;
  bVar1 = v->tt_;
  pTVar30[nelems].tt_ = bVar1;
  fs->nk = fs->nk + 1;
  if ((((bVar1 & 0x40) != 0) && ((f->marked & 0x20) != 0)) &&
     ((((v->value_).gc)->marked & 0x18) != 0)) {
    luaC_barrier_(L,(GCObject *)f,(v->value_).gc);
  }
  return nelems;
}

Assistant:

static int addk (FuncState *fs, Proto *f, TValue *v) {
  lua_State *L = fs->ls->L;
  int oldsize = f->sizek;
  int k = fs->nk;
  luaM_growvector(L, f->k, k, f->sizek, TValue, MAXARG_Ax, "constants");
  while (oldsize < f->sizek)
    setnilvalue(&f->k[oldsize++]);
  setobj(L, &f->k[k], v);
  fs->nk++;
  luaC_barrier(L, f, v);
  return k;
}